

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioScope.cpp
# Opt level: O0

void __thiscall AudioScope::AudioScope(AudioScope *this,QWidget *parent)

{
  byte bVar1;
  QPalette *pQVar2;
  WidgetAttribute WVar3;
  QColor local_60;
  QPalette local_50 [16];
  QPalette local_40 [8];
  QPalette pal;
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  AudioScope *this_local;
  
  local_18 = parent;
  parent_local = (QWidget *)this;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QFrame::QFrame(&this->super_QFrame,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_002d7730;
  *(undefined ***)&this->field_0x10 = &PTR__AudioScope_002d78e8;
  this->mBuffer = (Guarded<VisualizerBuffer> *)0x0;
  QColor::QColor(&this->mLineColor,white);
  WVar3 = (WidgetAttribute)this;
  QWidget::setAttribute(WVar3,true);
  QWidget::setAutoFillBackground(SUB81(this,0));
  pQVar2 = (QPalette *)QWidget::palette();
  QPalette::QPalette(local_40,pQVar2);
  QGuiApplication::palette();
  bVar1 = QPalette::isCopyOf(local_40);
  QPalette::~QPalette(local_50);
  if ((bVar1 & 1) != 0) {
    QColor::QColor(&local_60,black);
    QPalette::setColor(local_40,Window,&local_60);
    QWidget::setPalette((QPalette *)this);
  }
  QFrame::setFrameStyle(WVar3);
  QFrame::setLineWidth(WVar3);
  QWidget::setFixedHeight(WVar3);
  QPalette::~QPalette(local_40);
  return;
}

Assistant:

AudioScope::AudioScope(QWidget *parent) :
    QFrame(parent),
    mBuffer(nullptr),
    mLineColor(Qt::white)
{
    setAttribute(Qt::WA_StyledBackground);
    setAutoFillBackground(true);

    // Window is the background, default is black
    // WindowText is the line color for the scope, default is white
    auto pal = palette();
    if (pal.isCopyOf(QGuiApplication::palette())) {
        // only modify the palette if we have the default one
        pal.setColor(QPalette::Window, Qt::black);
        setPalette(pal);
    }

    setFrameStyle(QFrame::Box | QFrame::Plain);
    
    setLineWidth(TU::LINE_WIDTH);
    setFixedHeight(WAVE_HEIGHT * 2 + TU::LINE_WIDTH * 2);

}